

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O0

DecimalFormatSymbols * icu_63::DecimalFormatSymbols::createWithLastResortData(UErrorCode *status)

{
  UBool UVar1;
  DecimalFormatSymbols *this;
  size_t in_RSI;
  undefined8 local_48;
  DecimalFormatSymbols *sym;
  UErrorCode *status_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,in_RSI);
    local_48 = (DecimalFormatSymbols *)0x0;
    if (this != (DecimalFormatSymbols *)0x0) {
      DecimalFormatSymbols(this);
      local_48 = this;
    }
    if (local_48 == (DecimalFormatSymbols *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    status_local = (UErrorCode *)local_48;
  }
  else {
    status_local = (UErrorCode *)0x0;
  }
  return (DecimalFormatSymbols *)status_local;
}

Assistant:

DecimalFormatSymbols*
DecimalFormatSymbols::createWithLastResortData(UErrorCode& status) {
    if (U_FAILURE(status)) { return NULL; }
    DecimalFormatSymbols* sym = new DecimalFormatSymbols();
    if (sym == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    return sym;
}